

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc2b.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  istream *input_stream_00;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_7;
  ostringstream error_message_6;
  vector<double,_std::allocator<double>_> mlsa_digital_filter_coefficients;
  vector<double,_std::allocator<double>_> mel_cepstrum;
  int length;
  ostringstream error_message_5;
  MelCepstrumToMlsaDigitalFilterCoefficients mel_cepstrum_to_mlsa_digital_filter_coefficients;
  istream *input_stream;
  ostringstream error_message_4;
  ifstream ifs;
  ostringstream error_message_3;
  char *input_file;
  ostringstream error_message_2;
  int num_input_files;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  double alpha;
  int num_order;
  option *in_stack_ffffffffffffeee8;
  double *in_stack_ffffffffffffeef0;
  string *in_stack_ffffffffffffeef8;
  int num_order_00;
  allocator *paVar5;
  undefined4 in_stack_ffffffffffffef00;
  int in_stack_ffffffffffffef04;
  size_type in_stack_ffffffffffffef08;
  undefined6 in_stack_ffffffffffffef10;
  undefined1 in_stack_ffffffffffffef16;
  undefined1 in_stack_ffffffffffffef17;
  int *actual_write_size;
  vector<double,_std::allocator<double>_> *sequence_to_read;
  MelCepstrumToMlsaDigitalFilterCoefficients *in_stack_ffffffffffffef38;
  int in_stack_ffffffffffffef40;
  undefined1 in_stack_ffffffffffffef46;
  char *local_10b8;
  undefined7 in_stack_ffffffffffffef50;
  char *local_1070;
  byte local_1042;
  bool local_1012;
  allocator local_ff9;
  string local_ff8 [32];
  ostringstream local_fd8 [176];
  ostringstream *in_stack_fffffffffffff0d8;
  string *in_stack_fffffffffffff0e0;
  allocator local_e59;
  string local_e58 [32];
  ostringstream local_e38 [383];
  int local_cb9 [8];
  vector<double,_std::allocator<double>_> local_c99;
  int local_c80;
  allocator local_c79;
  string local_c78 [32];
  ostringstream local_c58 [376];
  MelCepstrumToMlsaDigitalFilterCoefficients local_ae0;
  char *local_ac0;
  undefined4 local_ab8;
  allocator local_ab1;
  string local_ab0 [32];
  ostringstream local_a90 [376];
  char local_918 [527];
  allocator local_709;
  string local_708 [32];
  ostringstream local_6e8 [376];
  char *local_570;
  allocator local_561;
  string local_560 [32];
  ostringstream local_540 [376];
  int local_3c8;
  allocator local_3c1;
  string local_3c0 [32];
  ostringstream local_3a0 [383];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  ostringstream local_1d8 [399];
  allocator local_49;
  string local_48 [36];
  int local_24;
  double local_20;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_20 = 0.35;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_24 = ya_getopt_long(in_stack_ffffffffffffef04,(char **)in_stack_ffffffffffffeef8,
                                   (char *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,
                                   (int *)0x103720), pcVar1 = ya_optarg, local_24 != -1) {
    if (local_24 == 0x61) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,pcVar1,&local_221);
      bVar2 = sptk::ConvertStringToDouble(in_stack_ffffffffffffeef8,in_stack_ffffffffffffeef0);
      local_1042 = 1;
      if (bVar2) {
        bVar2 = sptk::IsValidAlpha(local_20);
        local_1042 = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      if ((local_1042 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_3a0);
        std::operator<<((ostream *)local_3a0,"The argument for the -a option must be in (-1.0, 1.0)"
                       );
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c0,"mc2b",&local_3c1);
        sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
        std::__cxx11::string::~string(local_3c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a0);
        return local_4;
      }
    }
    else {
      if (local_24 == 0x68) {
        anon_unknown.dwarf_1728::PrintUsage
                  ((ostream *)CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
        return 0;
      }
      if (local_24 != 0x6d) {
        anon_unknown.dwarf_1728::PrintUsage
                  ((ostream *)CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
        return 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,pcVar1,&local_49);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffeef8,(int *)in_stack_ffffffffffffeef0);
      local_1012 = !bVar2 || local_14 < 0;
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      if (local_1012) {
        std::__cxx11::ostringstream::ostringstream(local_1d8);
        poVar4 = std::operator<<((ostream *)local_1d8,"The argument for the -m option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f8,"mc2b",&local_1f9);
        sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
        std::__cxx11::string::~string(local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d8);
        return local_4;
      }
    }
  }
  local_3c8 = local_8 - ya_optind;
  if (1 < local_3c8) {
    std::__cxx11::ostringstream::ostringstream(local_540);
    std::operator<<((ostream *)local_540,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_560,"mc2b",&local_561);
    sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
    std::__cxx11::string::~string(local_560);
    std::allocator<char>::~allocator((allocator<char> *)&local_561);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_540);
    return local_4;
  }
  if (local_3c8 == 0) {
    local_1070 = (char *)0x0;
  }
  else {
    local_1070 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_570 = local_1070;
  bVar2 = sptk::SetBinaryMode();
  num_order_00 = (int)((ulong)in_stack_ffffffffffffeef8 >> 0x20);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_6e8);
    std::operator<<((ostream *)local_6e8,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_708,"mc2b",&local_709);
    sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
    std::__cxx11::string::~string(local_708);
    std::allocator<char>::~allocator((allocator<char> *)&local_709);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_6e8);
    return local_4;
  }
  std::ifstream::ifstream(local_918);
  pcVar1 = local_570;
  if (local_570 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_918,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_a90);
      poVar4 = std::operator<<((ostream *)local_a90,"Cannot open file ");
      std::operator<<(poVar4,local_570);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ab0,"mc2b",&local_ab1);
      sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
      std::__cxx11::string::~string(local_ab0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
      local_4 = 1;
      local_ab8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_a90);
      goto LAB_001046bb;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    local_10b8 = (char *)&std::cin;
  }
  else {
    local_10b8 = local_918;
  }
  local_ac0 = local_10b8;
  sptk::MelCepstrumToMlsaDigitalFilterCoefficients::MelCepstrumToMlsaDigitalFilterCoefficients
            ((MelCepstrumToMlsaDigitalFilterCoefficients *)
             CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00),num_order_00,
             (double)in_stack_ffffffffffffeef0);
  bVar2 = sptk::MelCepstrumToMlsaDigitalFilterCoefficients::IsValid(&local_ae0);
  if (bVar2) {
    local_c80 = local_14 + 1;
    input_stream_00 = (istream *)(long)local_c80;
    sequence_to_read = &local_c99;
    std::allocator<double>::allocator((allocator<double> *)0x1042ab);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffef17,
                        CONCAT16(in_stack_ffffffffffffef16,in_stack_ffffffffffffef10)),
               in_stack_ffffffffffffef08,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
    std::allocator<double>::~allocator((allocator<double> *)0x1042d1);
    actual_write_size = local_cb9;
    std::allocator<double>::allocator((allocator<double> *)0x1042f0);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffef17,
                        CONCAT16(in_stack_ffffffffffffef16,in_stack_ffffffffffffef10)),
               in_stack_ffffffffffffef08,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
    std::allocator<double>::~allocator((allocator<double> *)0x104316);
    do {
      bVar2 = sptk::ReadStream<double>
                        ((bool)in_stack_ffffffffffffef46,in_stack_ffffffffffffef40,
                         (int)((ulong)in_stack_ffffffffffffef38 >> 0x20),
                         (int)in_stack_ffffffffffffef38,sequence_to_read,input_stream_00,
                         (int *)CONCAT17(bVar3,in_stack_ffffffffffffef50));
      if (!bVar2) {
        local_4 = 0;
        local_ab8 = 1;
        goto LAB_00104665;
      }
      bVar2 = sptk::MelCepstrumToMlsaDigitalFilterCoefficients::Run
                        (in_stack_ffffffffffffef38,sequence_to_read,
                         (vector<double,_std::allocator<double>_> *)input_stream_00);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_e38);
        std::operator<<((ostream *)local_e38,
                        "Failed to convert mel-cepstrum to MLSA digital filter coefficients");
        paVar5 = &local_e59;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e58,"mc2b",paVar5);
        sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
        std::__cxx11::string::~string(local_e58);
        std::allocator<char>::~allocator((allocator<char> *)&local_e59);
        local_4 = 1;
        local_ab8 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_e38);
        goto LAB_00104665;
      }
      bVar2 = sptk::WriteStream<double>
                        (in_stack_ffffffffffffef40,(int)((ulong)in_stack_ffffffffffffef38 >> 0x20),
                         sequence_to_read,(ostream *)input_stream_00,actual_write_size);
      in_stack_ffffffffffffef04 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffef04);
    } while (bVar2);
    std::__cxx11::ostringstream::ostringstream(local_fd8);
    std::operator<<((ostream *)local_fd8,"Failed to write MLSA digital filter coefficients");
    paVar5 = &local_ff9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ff8,"mc2b",paVar5);
    sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
    std::__cxx11::string::~string(local_ff8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ff9);
    local_4 = 1;
    local_ab8 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_fd8);
LAB_00104665:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_c58);
    std::operator<<((ostream *)local_c58,
                    "Failed to initialize MelCepstrumToMlsaDigitalFilterCoefficients");
    paVar5 = &local_c79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c78,"mc2b",paVar5);
    sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
    std::__cxx11::string::~string(local_c78);
    std::allocator<char>::~allocator((allocator<char> *)&local_c79);
    local_4 = 1;
    local_ab8 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_c58);
  }
  sptk::MelCepstrumToMlsaDigitalFilterCoefficients::~MelCepstrumToMlsaDigitalFilterCoefficients
            (&local_ae0);
LAB_001046bb:
  std::ifstream::~ifstream(local_918);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  double alpha(kDefaultAlpha);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:a:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mc2b", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &alpha) ||
            !sptk::IsValidAlpha(alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("mc2b", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("mc2b", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("mc2b", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("mc2b", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::MelCepstrumToMlsaDigitalFilterCoefficients
      mel_cepstrum_to_mlsa_digital_filter_coefficients(num_order, alpha);
  if (!mel_cepstrum_to_mlsa_digital_filter_coefficients.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize MelCepstrumToMlsaDigitalFilterCoefficients";
    sptk::PrintErrorMessage("mc2b", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> mel_cepstrum(length);
  std::vector<double> mlsa_digital_filter_coefficients(length);

  while (sptk::ReadStream(false, 0, 0, length, &mel_cepstrum, &input_stream,
                          NULL)) {
    if (!mel_cepstrum_to_mlsa_digital_filter_coefficients.Run(
            mel_cepstrum, &mlsa_digital_filter_coefficients)) {
      std::ostringstream error_message;
      error_message << "Failed to convert mel-cepstrum to MLSA digital "
                       "filter coefficients";
      sptk::PrintErrorMessage("mc2b", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, length, mlsa_digital_filter_coefficients,
                           &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write MLSA digital filter coefficients";
      sptk::PrintErrorMessage("mc2b", error_message);
      return 1;
    }
  }

  return 0;
}